

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O2

bool __thiscall
Omega_h::CmdLineItem::parse(CmdLineItem *this,int *p_argc,char **argv,int i,bool should_print)

{
  int iVar1;
  ostream *poVar2;
  
  if (this->parsed_ == true) {
    if (should_print) {
      poVar2 = std::operator<<((ostream *)&std::cout,"argument <");
      poVar2 = std::operator<<(poVar2,(string *)&this->name_);
      std::operator<<(poVar2," being parsed twice!\n");
    }
  }
  else {
    iVar1 = (*this->_vptr_CmdLineItem[2])(this);
    if ((char)iVar1 != '\0') {
      this->parsed_ = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool CmdLineItem::parse(int* p_argc, char** argv, int i, bool should_print) {
  if (parsed_) {
    if (should_print) {
      std::cout << "argument <" << name() << " being parsed twice!\n";
    }
    return false;
  }
  auto ok = parse_impl(p_argc, argv, i, should_print);
  if (ok) parsed_ = true;
  return ok;
}